

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<char>::addAll<kj::String>(Vector<char> *this,String *container)

{
  char *begin;
  char *end;
  String *container_local;
  Vector<char> *this_local;
  
  begin = String::begin(container);
  end = String::end(container);
  addAll<char*>(this,begin,end);
  return;
}

Assistant:

inline void addAll(Container&& container) {
    addAll(container.begin(), container.end());
  }